

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_pwr.cpp
# Opt level: O3

uchar * sz_compress_2d_pwr<float>
                  (float *data,size_t r1,size_t r2,double precision,size_t *compressed_size,
                  int BSIZE,bool block_independant)

{
  float *pfVar1;
  uchar *intArray;
  uchar *__src;
  ulong __size;
  size_t __size_00;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  size_t log_compressed_size;
  float *local_40;
  size_t local_38;
  
  __size = r2 * r1;
  pfVar1 = (float *)malloc(__size * 4);
  lVar2 = 1;
  intArray = (uchar *)calloc(1,__size);
  fVar7 = *data;
  fVar4 = fVar7;
  if (1 < __size) {
    do {
      fVar3 = data[lVar2];
      if (fVar3 <= fVar4) {
        fVar4 = fVar3;
      }
      if (fVar7 <= fVar3) {
        fVar7 = fVar3;
      }
      lVar2 = lVar2 + 1;
    } while (__size - lVar2 != 0);
  }
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar3 = log2f(ABS(fVar4));
    if ((fVar7 == 0.0) && (!NAN(fVar7))) goto LAB_00105c6e;
    fVar5 = log2f(ABS(fVar7));
    fVar7 = (float)(-(uint)(ABS(fVar5) < ABS(fVar3)) & (uint)ABS(fVar4) |
                   ~-(uint)(ABS(fVar5) < ABS(fVar3)) & (uint)ABS(fVar7));
  }
  else {
    fVar7 = ABS(fVar7);
  }
  fVar3 = log2f(fVar7);
LAB_00105c6e:
  fVar7 = ABS(fVar3);
  if (__size == 0) {
    fVar3 = ABS(fVar3);
  }
  else {
    lVar2 = 0;
    fVar3 = ABS(fVar3);
    do {
      fVar4 = data[lVar2];
      if (fVar4 < 0.0) {
        intArray[lVar2] = '\x01';
        fVar4 = -fVar4;
      }
      pfVar1[lVar2] = fVar4;
      if (0.0 < fVar4) {
        fVar5 = log2f(fVar4);
        pfVar1[lVar2] = fVar5;
        fVar4 = fVar5;
        if (fVar5 <= fVar7) {
          fVar4 = fVar7;
        }
        fVar7 = fVar4;
        if (fVar5 < fVar3) {
          fVar3 = fVar5;
        }
      }
      lVar2 = lVar2 + 1;
    } while (__size - lVar2 != 0);
  }
  dVar6 = log2(precision + 1.0);
  fVar4 = ABS(fVar3);
  if (ABS(fVar3) <= fVar7) {
    fVar4 = fVar7;
  }
  dVar6 = (double)(fVar4 * -1.1920929e-07) + dVar6;
  if (__size != 0) {
    lVar2 = 0;
    do {
      if ((data[lVar2] == 0.0) && (!NAN(data[lVar2]))) {
        pfVar1[lVar2] = (float)(dVar6 * -2.0001 + (double)fVar3);
      }
      lVar2 = lVar2 + 1;
    } while (__size - lVar2 != 0);
  }
  local_38 = 0;
  __src = sz_compress_2d<float>(pfVar1,r1,r2,dVar6,&local_38,BSIZE,block_independant);
  free(pfVar1);
  __size_00 = (__size - 1 >> 3) + local_38 + 5;
  *compressed_size = __size_00;
  pfVar1 = (float *)malloc(__size_00);
  *pfVar1 = (float)(dVar6 * -1.0001 + (double)fVar3);
  local_40 = pfVar1 + 1;
  convertIntArray2ByteArray_fast_1b_to_result_sz(intArray,__size,(uchar **)&local_40);
  memcpy(local_40,__src,local_38);
  free(intArray);
  free(__src);
  return (uchar *)pfVar1;
}

Assistant:

unsigned char *
sz_compress_2d_pwr(const T * data, size_t r1, size_t r2, double precision, size_t& compressed_size, int BSIZE, bool block_independant){
	size_t num_elements = r1 * r2;
	T * log_data = (T *) malloc(num_elements * sizeof(T));

	unsigned char * signs = (unsigned char *) malloc(num_elements);
	memset(signs, 0, num_elements);
	// preprocess
	T min_data = data[0];
	T max_data = data[0];
	for(int i=1; i<num_elements; i++){
		min_data = MIN(min_data, data[i]);
		max_data = MAX(max_data, data[i]);
	}
	T max_abs_log_data = 0;
    if(min_data == 0) max_abs_log_data = fabs(log2(fabs(max_data)));
    else if(max_data == 0) max_abs_log_data = fabs(log2(fabs(min_data)));
    else max_abs_log_data = fabs(log2(fabs(min_data))) > fabs(log2(fabs(max_data))) ? fabs(log2(fabs(min_data))) : fabs(log2(fabs(max_data)));
    T min_log_data = max_abs_log_data;
	for(size_t i=0; i<num_elements; i++){
		if(data[i] < 0){
			signs[i] = 1;
			log_data[i] = -data[i];
		}
		else
			log_data[i] = data[i];
		if(log_data[i] > 0){
			log_data[i] = log2(log_data[i]);
			if(log_data[i] > max_abs_log_data) max_abs_log_data = log_data[i];
			if(log_data[i] < min_log_data) min_log_data = log_data[i];
		}
	}
	if(fabs(min_log_data) > max_abs_log_data) max_abs_log_data = fabs(min_log_data);
	double log_precision = log2(1.0 + precision) - max_abs_log_data * std::numeric_limits<T>::epsilon();
	for(size_t i=0; i<num_elements; i++){
		if(data[i] == 0){
			log_data[i] = min_log_data - 2.0001*log_precision;
		}
	}
	size_t log_compressed_size = 0;
	unsigned char * log_compressed = sz_compress_2d(log_data, r1, r2, log_precision, log_compressed_size, BSIZE, block_independant);
    free(log_data);
	size_t sign_size = (num_elements-1)/8 + 1;
	T threshold = min_log_data - 1.0001*log_precision;
	compressed_size = sizeof(T) + sign_size + log_compressed_size;
    unsigned char * final_compressed = (unsigned char *) malloc(compressed_size);
    unsigned char * final_compressed_pos = final_compressed;
    memcpy(final_compressed_pos, &threshold, sizeof(T));
    final_compressed_pos += sizeof(T);
	convertIntArray2ByteArray_fast_1b_to_result_sz(signs, num_elements, final_compressed_pos);
	memcpy(final_compressed_pos, log_compressed, log_compressed_size);
	free(signs);
	free(log_compressed);
	return final_compressed;
}